

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eliminate_dead_members_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::EliminateDeadMembersPass::UpdateCompsiteExtract
          (EliminateDeadMembersPass *this,Instruction *inst)

{
  bool bVar1;
  Op OVar2;
  IRContext *pIVar3;
  pointer pOVar4;
  uint32_t uVar5;
  _Type member_idx;
  array<signed_char,_4UL> aVar6;
  const_iterator __cbeg;
  Instruction *pIVar7;
  Operand *__args;
  ulong uVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  uint32_t i;
  uint32_t index;
  OperandList new_operands;
  undefined1 local_a0 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_80;
  undefined1 local_78 [40];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_50;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_48;
  
  if (inst->opcode_ == OpCompositeExtract) {
LAB_0056610b:
    uVar10 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar10 = (uint)inst->has_result_id_;
    }
    uVar11 = 1;
  }
  else {
    if (inst->opcode_ != OpSpecConstantOp) {
LAB_00566464:
      __assert_fail("inst->opcode() == spv::Op::OpCompositeExtract || (inst->opcode() == spv::Op::OpSpecConstantOp && spv::Op(inst->GetSingleWordInOperand(kSpecConstOpOpcodeIdx)) == spv::Op::OpCompositeExtract)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                    ,0x22f,
                    "bool spvtools::opt::EliminateDeadMembersPass::UpdateCompsiteExtract(Instruction *)"
                   );
    }
    uVar5 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar5 = (uint)inst->has_result_id_;
    }
    uVar5 = Instruction::GetSingleWordOperand(inst,uVar5);
    if (uVar5 != 0x51) goto LAB_00566464;
    if (inst->opcode_ != OpSpecConstantOp) goto LAB_0056610b;
    uVar10 = (inst->has_result_id_ & 1) + 1;
    if (inst->has_type_id_ == false) {
      uVar10 = (uint)inst->has_result_id_;
    }
    uVar10 = uVar10 + 1;
    uVar11 = 2;
  }
  uVar5 = Instruction::GetSingleWordOperand(inst,uVar10);
  pIVar3 = (this->super_MemPass).super_Pass.context_;
  if ((pIVar3->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar3);
  }
  pIVar7 = analysis::DefUseManager::GetDef
                     ((pIVar3->def_use_mgr_)._M_t.
                      super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                      .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                      _M_head_impl,uVar5);
  index = 0;
  uVar5 = 0;
  if (pIVar7->has_type_id_ == true) {
    uVar5 = Instruction::GetSingleWordOperand(pIVar7,0);
  }
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  do {
    __args = Instruction::GetInOperand(inst,index);
    std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
    emplace_back<spvtools::opt::Operand&>
              ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_48,
               __args);
    index = index + 1;
  } while (uVar11 != index);
  uVar10 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar10 = (uint)inst->has_result_id_;
  }
  if (uVar11 < (int)((ulong)((long)(inst->operands_).
                                   super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(inst->operands_).
                                  super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
               uVar10) {
    bVar9 = false;
    do {
      bVar12 = bVar9;
      member_idx = (_Type)Instruction::GetSingleWordOperand(inst,uVar10 + uVar11);
      aVar6._M_elems = (_Type)GetNewMemberIndex(this,uVar5,(uint32_t)member_idx);
      if (aVar6._M_elems == (_Type)0xffffffff) {
        __assert_fail("new_member_idx != kRemovedMember",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                      ,0x241,
                      "bool spvtools::opt::EliminateDeadMembersPass::UpdateCompsiteExtract(Instruction *)"
                     );
      }
      local_a0._0_8_ = &PTR__SmallVector_00b02ef8;
      local_a0._24_8_ = local_a0 + 0x10;
      local_80._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_a0._8_8_ = 1;
      local_78._0_4_ = SPV_OPERAND_TYPE_LITERAL_INTEGER;
      local_78._8_8_ = &PTR__SmallVector_00b02ef8;
      local_78._16_8_ = 0;
      local_78._32_8_ = local_78 + 0x18;
      local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_a0._16_4_ = aVar6._M_elems;
      utils::SmallVector<unsigned_int,_2UL>::operator=
                ((SmallVector<unsigned_int,_2UL> *)(local_78 + 8),
                 (SmallVector<unsigned_int,_2UL> *)local_a0);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::
      emplace_back<spvtools::opt::Operand>(&local_48,(Operand *)local_78);
      local_78._8_8_ = &PTR__SmallVector_00b02ef8;
      if ((_Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )local_50._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_50,local_50._M_head_impl);
      }
      local_50._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
      local_a0._0_8_ = &PTR__SmallVector_00b02ef8;
      if (local_80._M_head_impl != (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
        std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::operator()
                  ((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_> *)
                   &local_80,local_80._M_head_impl);
      }
      pIVar3 = (this->super_MemPass).super_Pass.context_;
      if ((pIVar3->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
        IRContext::BuildDefUseManager(pIVar3);
      }
      pIVar7 = analysis::DefUseManager::GetDef
                         ((pIVar3->def_use_mgr_)._M_t.
                          super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                          .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                          _M_head_impl,uVar5);
      OVar2 = pIVar7->opcode_;
      if ((int)OVar2 < 0x1168) {
        if (OpTypeStruct < OVar2) {
LAB_00566445:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/eliminate_dead_members_pass.cpp"
                        ,0x259,
                        "bool spvtools::opt::EliminateDeadMembersPass::UpdateCompsiteExtract(Instruction *)"
                       );
        }
        if ((0x31800000U >> (OVar2 & OpTypeOpaque) & 1) != 0) goto LAB_005662fe;
        if (OVar2 != OpTypeStruct) goto LAB_00566445;
        uVar10 = (pIVar7->has_result_id_ & 1) + 1;
        if (pIVar7->has_type_id_ == false) {
          uVar10 = (uint)pIVar7->has_result_id_;
        }
        uVar5 = uVar10 + (int)aVar6._M_elems;
      }
      else {
        if (((OVar2 != OpTypeCooperativeMatrixKHR) && (OVar2 != OpTypeCooperativeVectorNV)) &&
           (OVar2 != OpTypeCooperativeMatrixNV)) goto LAB_00566445;
LAB_005662fe:
        uVar5 = (pIVar7->has_result_id_ & 1) + 1;
        if (pIVar7->has_type_id_ == false) {
          uVar5 = (uint)pIVar7->has_result_id_;
        }
      }
      uVar5 = Instruction::GetSingleWordOperand(pIVar7,uVar5);
      uVar11 = uVar11 + 1;
      pOVar4 = (inst->operands_).
               super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar8 = (long)(inst->operands_).
                    super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar4;
      bVar1 = inst->has_result_id_;
      uVar10 = (bVar1 & 1) + 1;
      if (inst->has_type_id_ == false) {
        uVar10 = (uint)bVar1;
      }
      bVar9 = (bool)(bVar12 | member_idx != aVar6._M_elems);
    } while (uVar11 < (int)(uVar8 >> 4) * -0x55555555 - uVar10);
    if (bVar12 || member_idx != aVar6._M_elems) {
      uVar10 = (bVar1 & 1) + 1;
      if (inst->has_type_id_ == false) {
        uVar10 = (uint)bVar1;
      }
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::_M_erase
                (&inst->operands_,
                 (Operand *)
                 ((long)((pOVar4->words).buffer + 0xfffffffffffffffa) + (ulong)(uVar10 * 0x30)),
                 (Operand *)(uVar8 + (long)pOVar4));
      std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<spvtools::opt::Operand*,std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>>>
                ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)
                 &inst->operands_,
                 (inst->operands_).
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish,
                 local_48.
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_48.
                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      pIVar3 = (this->super_MemPass).super_Pass.context_;
      bVar9 = true;
      if ((pIVar3->valid_analyses_ & kAnalysisBegin) != kAnalysisNone) {
        analysis::DefUseManager::UpdateDefUse
                  ((pIVar3->def_use_mgr_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                   .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                   _M_head_impl,inst);
      }
      goto LAB_00566408;
    }
  }
  bVar9 = false;
LAB_00566408:
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector(&local_48);
  return bVar9;
}

Assistant:

bool EliminateDeadMembersPass::UpdateCompsiteExtract(Instruction* inst) {
  assert(inst->opcode() == spv::Op::OpCompositeExtract ||
         (inst->opcode() == spv::Op::OpSpecConstantOp &&
          spv::Op(inst->GetSingleWordInOperand(kSpecConstOpOpcodeIdx)) ==
              spv::Op::OpCompositeExtract));

  uint32_t first_operand = 0;
  if (inst->opcode() == spv::Op::OpSpecConstantOp) {
    first_operand = 1;
  }
  uint32_t object_id = inst->GetSingleWordInOperand(first_operand);
  Instruction* object_inst = get_def_use_mgr()->GetDef(object_id);
  uint32_t type_id = object_inst->type_id();

  Instruction::OperandList new_operands;
  bool modified = false;
  for (uint32_t i = 0; i < first_operand + 1; i++) {
    new_operands.emplace_back(inst->GetInOperand(i));
  }
  for (uint32_t i = first_operand + 1; i < inst->NumInOperands(); ++i) {
    uint32_t member_idx = inst->GetSingleWordInOperand(i);
    uint32_t new_member_idx = GetNewMemberIndex(type_id, member_idx);
    assert(new_member_idx != kRemovedMember);
    if (member_idx != new_member_idx) {
      modified = true;
    }
    new_operands.emplace_back(
        Operand({SPV_OPERAND_TYPE_LITERAL_INTEGER, {new_member_idx}}));

    Instruction* type_inst = get_def_use_mgr()->GetDef(type_id);
    switch (type_inst->opcode()) {
      case spv::Op::OpTypeStruct:
        // The type will have already been rewritten, so use the new member
        // index.
        type_id = type_inst->GetSingleWordInOperand(new_member_idx);
        break;
      case spv::Op::OpTypeArray:
      case spv::Op::OpTypeRuntimeArray:
      case spv::Op::OpTypeVector:
      case spv::Op::OpTypeMatrix:
      case spv::Op::OpTypeCooperativeMatrixNV:
      case spv::Op::OpTypeCooperativeMatrixKHR:
      case spv::Op::OpTypeCooperativeVectorNV:
        type_id = type_inst->GetSingleWordInOperand(0);
        break;
      default:
        assert(false);
    }
  }

  if (!modified) {
    return false;
  }
  inst->SetInOperands(std::move(new_operands));
  context()->UpdateDefUse(inst);
  return true;
}